

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O2

void prepare_coeffs(InterpFilterParams *filter_params,int subpel_q4,__m256i *coeffs)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int16_t *piVar5;
  ulong uVar6;
  
  piVar5 = filter_params->filter_ptr;
  uVar6 = (ulong)((uint)filter_params->taps * (subpel_q4 & 0xfU));
  uVar1 = *(undefined4 *)(piVar5 + uVar6);
  uVar2 = *(undefined4 *)(piVar5 + uVar6 + 2);
  uVar3 = *(undefined4 *)(piVar5 + uVar6 + 4);
  uVar4 = *(undefined4 *)(piVar5 + uVar6 + 6);
  *(undefined4 *)*coeffs = uVar1;
  *(undefined4 *)((long)*coeffs + 4) = uVar1;
  *(undefined4 *)(*coeffs + 1) = uVar1;
  *(undefined4 *)((long)*coeffs + 0xc) = uVar1;
  *(undefined4 *)(*coeffs + 2) = uVar1;
  *(undefined4 *)((long)*coeffs + 0x14) = uVar1;
  *(undefined4 *)(*coeffs + 3) = uVar1;
  *(undefined4 *)((long)*coeffs + 0x1c) = uVar1;
  *(undefined4 *)coeffs[1] = uVar2;
  *(undefined4 *)((long)coeffs[1] + 4) = uVar2;
  *(undefined4 *)(coeffs[1] + 1) = uVar2;
  *(undefined4 *)((long)coeffs[1] + 0xc) = uVar2;
  *(undefined4 *)(coeffs[1] + 2) = uVar2;
  *(undefined4 *)((long)coeffs[1] + 0x14) = uVar2;
  *(undefined4 *)(coeffs[1] + 3) = uVar2;
  *(undefined4 *)((long)coeffs[1] + 0x1c) = uVar2;
  *(undefined4 *)coeffs[2] = uVar3;
  *(undefined4 *)((long)coeffs[2] + 4) = uVar3;
  *(undefined4 *)(coeffs[2] + 1) = uVar3;
  *(undefined4 *)((long)coeffs[2] + 0xc) = uVar3;
  *(undefined4 *)(coeffs[2] + 2) = uVar3;
  *(undefined4 *)((long)coeffs[2] + 0x14) = uVar3;
  *(undefined4 *)(coeffs[2] + 3) = uVar3;
  *(undefined4 *)((long)coeffs[2] + 0x1c) = uVar3;
  *(undefined4 *)coeffs[3] = uVar4;
  *(undefined4 *)((long)coeffs[3] + 4) = uVar4;
  *(undefined4 *)(coeffs[3] + 1) = uVar4;
  *(undefined4 *)((long)coeffs[3] + 0xc) = uVar4;
  *(undefined4 *)(coeffs[3] + 2) = uVar4;
  *(undefined4 *)((long)coeffs[3] + 0x14) = uVar4;
  *(undefined4 *)(coeffs[3] + 3) = uVar4;
  *(undefined4 *)((long)coeffs[3] + 0x1c) = uVar4;
  return;
}

Assistant:

static inline void prepare_coeffs(const InterpFilterParams *const filter_params,
                                  const int subpel_q4,
                                  __m256i *const coeffs /* [4] */) {
  const int16_t *filter = av1_get_interp_filter_subpel_kernel(
      filter_params, subpel_q4 & SUBPEL_MASK);

  const __m128i coeff_8 = _mm_loadu_si128((__m128i *)filter);
  const __m256i coeff = _mm256_broadcastsi128_si256(coeff_8);

  // coeffs 0 1 0 1 0 1 0 1
  coeffs[0] = _mm256_shuffle_epi32(coeff, 0x00);
  // coeffs 2 3 2 3 2 3 2 3
  coeffs[1] = _mm256_shuffle_epi32(coeff, 0x55);
  // coeffs 4 5 4 5 4 5 4 5
  coeffs[2] = _mm256_shuffle_epi32(coeff, 0xaa);
  // coeffs 6 7 6 7 6 7 6 7
  coeffs[3] = _mm256_shuffle_epi32(coeff, 0xff);
}